

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::SetNetworkActive(CConnman *this,bool active)

{
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  bool active_local;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
  source_file._M_len = 0x57;
  logging_function._M_str = "SetNetworkActive";
  logging_function._M_len = 0x10;
  active_local = active;
  LogPrintFormatInternal<char[17],bool>
            (logging_function,source_file,0xc5d,ALL,Info,(ConstevalFormatString<2U>)0xf7a277,
             (char (*) [17])"SetNetworkActive",&active_local);
  if (active_local != (bool)((this->fNetworkActive)._M_base._M_i & 1U)) {
    LOCK();
    (this->fNetworkActive)._M_base._M_i = active_local;
    UNLOCK();
    if (this->m_client_interface != (CClientUIInterface *)0x0) {
      CClientUIInterface::NotifyNetworkActiveChanged
                (this->m_client_interface,(bool)((this->fNetworkActive)._M_base._M_i & 1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::SetNetworkActive(bool active)
{
    LogPrintf("%s: %s\n", __func__, active);

    if (fNetworkActive == active) {
        return;
    }

    fNetworkActive = active;

    if (m_client_interface) {
        m_client_interface->NotifyNetworkActiveChanged(fNetworkActive);
    }
}